

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkSpace.cc
# Opt level: O2

LongReadsDatastore * __thiscall
WorkSpace::add_long_reads_datastore(WorkSpace *this,string *filename,string *name)

{
  __type _Var1;
  long lVar2;
  runtime_error *prVar3;
  pointer pbVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> n;
  
  lVar2 = (long)(this->long_reads_datastores).
                super__Vector_base<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->long_reads_datastores).
                super__Vector_base<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (100 < (ulong)(lVar2 / 0x158)) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10,filename,lVar2 % 0x158);
    std::runtime_error::runtime_error
              (prVar3,
               "Maximum items exceeded, please increase MAX_WORKSPACE_VECTOR_SIZE compile option to add more items"
              );
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  list_long_reads_datastores_abi_cxx11_(&local_68,this);
  pbVar4 = local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pbVar4 == local_68.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      std::vector<LongReadsDatastore,std::allocator<LongReadsDatastore>>::
      emplace_back<WorkSpace&,std::__cxx11::string_const&>
                ((vector<LongReadsDatastore,std::allocator<LongReadsDatastore>> *)
                 &this->long_reads_datastores,this,filename);
      if (name->_M_string_length != 0) {
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(this->long_reads_datastores).
                    super__Vector_base<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1].name);
      }
      return (this->long_reads_datastores).
             super__Vector_base<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    }
    std::__cxx11::string::string((string *)&n,(string *)pbVar4);
    _Var1 = std::operator==(&n,name);
    if (_Var1) break;
    std::__cxx11::string::~string((string *)&n);
    pbVar4 = pbVar4 + 1;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"Name is already in use");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

LongReadsDatastore &WorkSpace::add_long_reads_datastore(const std::string &filename, const std::string &name) {
    if (long_reads_datastores.size() > MAX_WORKSPACE_VECTOR_SIZE) {
        throw std::runtime_error("Maximum items exceeded, please increase MAX_WORKSPACE_VECTOR_SIZE compile option to add more items");
    }
    for (auto n:list_long_reads_datastores()) if (n==name) throw std::runtime_error("Name is already in use");
    long_reads_datastores.emplace_back(*this, filename);
    if (!name.empty()) long_reads_datastores.back().name = name;
    return long_reads_datastores.back();
}